

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void iidentity_row_8xn_ssse3
               (__m128i *out,int32_t *input,int stride,int shift,int height,int txw_idx,
               int rect_type)

{
  long lVar1;
  int32_t *input_row;
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar11 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  auVar4 = _DAT_004c0bf0;
  auVar3._0_4_ = CONCAT22((short)((1 << (0xbU - (char)shift & 0x1f)) + 0x800),
                          (short)NewSqrt2list[height]);
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  if ((txw_idx == -1) || (txw_idx == 1)) {
    pauVar2 = (undefined1 (*) [16])(input + 4);
    auVar5 = ZEXT416(0xcU - shift);
    for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
      auVar6 = packssdw(pauVar2[-1],*pauVar2);
      auVar6 = pmulhrsw(auVar6,auVar4);
      auVar19._0_12_ = auVar6._0_12_;
      auVar19._12_2_ = auVar6._6_2_;
      auVar19._14_2_ = 1;
      auVar18._12_4_ = auVar19._12_4_;
      auVar18._0_10_ = auVar6._0_10_;
      auVar18._10_2_ = 1;
      auVar17._10_6_ = auVar18._10_6_;
      auVar17._0_8_ = auVar6._0_8_;
      auVar17._8_2_ = auVar6._4_2_;
      auVar16._8_8_ = auVar17._8_8_;
      auVar16._0_8_ = 0x1000000000000;
      auVar15._6_10_ = auVar16._6_10_;
      auVar15._4_2_ = auVar6._2_2_;
      auVar15._0_2_ = auVar6._0_2_;
      auVar15._2_2_ = 1;
      auVar7._2_2_ = 0;
      auVar7._0_2_ = auVar6._8_2_;
      auVar7._4_2_ = auVar6._10_2_;
      auVar7._6_2_ = 0;
      auVar7._8_2_ = auVar6._12_2_;
      auVar7._10_2_ = 0;
      auVar7._12_2_ = auVar6._14_2_;
      auVar7._14_2_ = 1;
      auVar20 = pmaddwd(auVar15,auVar3);
      auVar6 = pmaddwd(auVar7,auVar3);
      auVar21._0_4_ = auVar20._0_4_ >> auVar5;
      auVar21._4_4_ = auVar20._4_4_ >> auVar5;
      auVar21._8_4_ = auVar20._8_4_ >> auVar5;
      auVar21._12_4_ = auVar20._12_4_ >> auVar5;
      auVar8._0_4_ = auVar6._0_4_ >> auVar5;
      auVar8._4_4_ = auVar6._4_4_ >> auVar5;
      auVar8._8_4_ = auVar6._8_4_ >> auVar5;
      auVar8._12_4_ = auVar6._12_4_ >> auVar5;
      auVar6 = packssdw(auVar21,auVar8);
      *(undefined1 (*) [16])((long)*out + lVar1) = auVar6;
      pauVar2 = (undefined1 (*) [16])(*pauVar2 + (long)stride * 4);
    }
  }
  else {
    pauVar2 = (undefined1 (*) [16])(input + 4);
    auVar4 = ZEXT416(0xcU - shift);
    for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x10) {
      auVar5 = packssdw(pauVar2[-1],*pauVar2);
      auVar13._0_12_ = auVar5._0_12_;
      auVar13._12_2_ = auVar5._6_2_;
      auVar13._14_2_ = 1;
      auVar12._12_4_ = auVar13._12_4_;
      auVar12._0_10_ = auVar5._0_10_;
      auVar12._10_2_ = 1;
      auVar11._10_6_ = auVar12._10_6_;
      auVar11._0_8_ = auVar5._0_8_;
      auVar11._8_2_ = auVar5._4_2_;
      auVar10._8_8_ = auVar11._8_8_;
      auVar10._0_8_ = 0x1000000000000;
      auVar9._6_10_ = auVar10._6_10_;
      auVar9._4_2_ = auVar5._2_2_;
      auVar9._0_2_ = auVar5._0_2_;
      auVar9._2_2_ = 1;
      auVar6._2_2_ = 0;
      auVar6._0_2_ = auVar5._8_2_;
      auVar6._4_2_ = auVar5._10_2_;
      auVar6._6_2_ = 0;
      auVar6._8_2_ = auVar5._12_2_;
      auVar6._10_2_ = 0;
      auVar6._12_2_ = auVar5._14_2_;
      auVar6._14_2_ = 1;
      auVar20 = pmaddwd(auVar9,auVar3);
      auVar5 = pmaddwd(auVar6,auVar3);
      auVar14._0_4_ = auVar20._0_4_ >> auVar4;
      auVar14._4_4_ = auVar20._4_4_ >> auVar4;
      auVar14._8_4_ = auVar20._8_4_ >> auVar4;
      auVar14._12_4_ = auVar20._12_4_ >> auVar4;
      auVar20._0_4_ = auVar5._0_4_ >> auVar4;
      auVar20._4_4_ = auVar5._4_4_ >> auVar4;
      auVar20._8_4_ = auVar5._8_4_ >> auVar4;
      auVar20._12_4_ = auVar5._12_4_ >> auVar4;
      auVar5 = packssdw(auVar14,auVar20);
      *(undefined1 (*) [16])((long)*out + lVar1) = auVar5;
      pauVar2 = (undefined1 (*) [16])(*pauVar2 + (long)stride * 4);
    }
  }
  return;
}

Assistant:

static inline void iidentity_row_8xn_ssse3(__m128i *out, const int32_t *input,
                                           int stride, int shift, int height,
                                           int txw_idx, int rect_type) {
  const int32_t *input_row = input;
  const __m128i scale = _mm_set1_epi16(NewSqrt2list[txw_idx]);
  const __m128i rounding = _mm_set1_epi16((1 << (NewSqrt2Bits - 1)) +
                                          (1 << (NewSqrt2Bits - shift - 1)));
  const __m128i one = _mm_set1_epi16(1);
  const __m128i scale_rounding = _mm_unpacklo_epi16(scale, rounding);
  if (rect_type != 1 && rect_type != -1) {
    for (int i = 0; i < height; ++i) {
      const __m128i src = load_32bit_to_16bit(input_row);
      input_row += stride;
      __m128i lo = _mm_unpacklo_epi16(src, one);
      __m128i hi = _mm_unpackhi_epi16(src, one);
      lo = _mm_madd_epi16(lo, scale_rounding);
      hi = _mm_madd_epi16(hi, scale_rounding);
      lo = _mm_srai_epi32(lo, NewSqrt2Bits - shift);
      hi = _mm_srai_epi32(hi, NewSqrt2Bits - shift);
      out[i] = _mm_packs_epi32(lo, hi);
    }
  } else {
    const __m128i rect_scale =
        _mm_set1_epi16(NewInvSqrt2 << (15 - NewSqrt2Bits));
    for (int i = 0; i < height; ++i) {
      __m128i src = load_32bit_to_16bit(input_row);
      src = _mm_mulhrs_epi16(src, rect_scale);
      input_row += stride;
      __m128i lo = _mm_unpacklo_epi16(src, one);
      __m128i hi = _mm_unpackhi_epi16(src, one);
      lo = _mm_madd_epi16(lo, scale_rounding);
      hi = _mm_madd_epi16(hi, scale_rounding);
      lo = _mm_srai_epi32(lo, NewSqrt2Bits - shift);
      hi = _mm_srai_epi32(hi, NewSqrt2Bits - shift);
      out[i] = _mm_packs_epi32(lo, hi);
    }
  }
}